

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_epoll.c
# Opt level: O2

void epoll_poll(ev_loop *loop,ev_tstamp timeout)

{
  byte bVar1;
  ANFD *pAVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  epoll_event *peVar8;
  epoll_event *__event;
  uint uVar9;
  long lVar10;
  bool bVar11;
  
  if (loop->epoll_epermcnt != 0) {
    timeout = 0.0;
  }
  if (loop->release_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->release_cb)(loop);
  }
  uVar4 = epoll_wait(loop->backend_fd,(epoll_event *)loop->epoll_events,loop->epoll_eventmax,
                     (int)(timeout * 1000.0));
  if (loop->acquire_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->acquire_cb)(loop);
  }
  if ((int)uVar4 < 0) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      ev_syserr("(libev) epoll_wait");
      return;
    }
  }
  else {
    for (lVar10 = 0; (ulong)uVar4 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
      pAVar2 = loop->anfds;
      peVar8 = loop->epoll_events;
      uVar3 = *(undefined8 *)((long)&peVar8->data + lVar10);
      iVar6 = (int)uVar3;
      uVar9 = *(uint *)((long)&peVar8->events + lVar10);
      if (pAVar2[iVar6].egen == (uint)((ulong)uVar3 >> 0x20)) {
        bVar1 = pAVar2[iVar6].events;
        uVar9 = (uint)((uVar9 & 0x19) != 0) + (uint)((uVar9 & 0x1c) != 0) * 2;
        if ((uVar9 & ~(uint)bVar1) != 0) {
          __event = (epoll_event *)((long)&peVar8->events + lVar10);
          pAVar2[iVar6].emask = bVar1;
          __event->events = (bVar1 & 1) + (bVar1 & 2) * 2;
          iVar5 = epoll_ctl(loop->backend_fd,3 - (uint)(bVar1 == 0),iVar6,__event);
          if (iVar5 != 0) goto LAB_00108ba6;
        }
        fd_event(loop,iVar6,uVar9);
      }
      else {
LAB_00108ba6:
        loop->postfork = loop->postfork | 2;
      }
    }
    if (uVar4 == loop->epoll_eventmax) {
      ev_realloc(loop->epoll_events,0);
      iVar6 = array_nextsize(0xc,loop->epoll_eventmax,loop->epoll_eventmax + 1);
      loop->epoll_eventmax = iVar6;
      peVar8 = (epoll_event *)ev_realloc((void *)0x0,(long)iVar6 * 0xc);
      loop->epoll_events = peVar8;
    }
    lVar10 = (long)loop->epoll_epermcnt;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      pAVar2 = loop->anfds;
      piVar7 = loop->epoll_eperms;
      iVar6 = piVar7[lVar10];
      if (((char)pAVar2[iVar6].emask < '\0') &&
         (uVar4 = pAVar2[iVar6].events & 3, (char)uVar4 != '\0')) {
        fd_event(loop,iVar6,uVar4);
      }
      else {
        iVar5 = loop->epoll_epermcnt;
        loop->epoll_epermcnt = iVar5 + -1;
        piVar7[lVar10] = piVar7[(long)iVar5 + -1];
        pAVar2[iVar6].emask = '\0';
      }
    }
  }
  return;
}

Assistant:

static void
epoll_poll (EV_P_ ev_tstamp timeout)
{
  int i;
  int eventcnt;

  if (expect_false (epoll_epermcnt))
    timeout = 0.;

  /* epoll wait times cannot be larger than (LONG_MAX - 999UL) / HZ msecs, which is below */
  /* the default libev max wait time, however. */
  EV_RELEASE_CB;
  eventcnt = epoll_wait (backend_fd, epoll_events, epoll_eventmax, timeout * 1e3);
  EV_ACQUIRE_CB;

  if (expect_false (eventcnt < 0))
    {
      if (errno != EINTR)
        ev_syserr ("(libev) epoll_wait");

      return;
    }

  for (i = 0; i < eventcnt; ++i)
    {
      struct epoll_event *ev = epoll_events + i;

      int fd = (uint32_t)ev->data.u64; /* mask out the lower 32 bits */
      int want = anfds [fd].events;
      int got  = (ev->events & (EPOLLOUT | EPOLLERR | EPOLLHUP) ? EV_WRITE : 0)
               | (ev->events & (EPOLLIN  | EPOLLERR | EPOLLHUP) ? EV_READ  : 0);

      /*
       * check for spurious notification.
       * this only finds spurious notifications on egen updates
       * other spurious notifications will be found by epoll_ctl, below
       * we assume that fd is always in range, as we never shrink the anfds array
       */
      if (expect_false ((uint32_t)anfds [fd].egen != (uint32_t)(ev->data.u64 >> 32)))
        {
          /* recreate kernel state */
          postfork |= 2;
          continue;
        }

      if (expect_false (got & ~want))
        {
          anfds [fd].emask = want;

          /*
           * we received an event but are not interested in it, try mod or del
           * this often happens because we optimistically do not unregister fds
           * when we are no longer interested in them, but also when we get spurious
           * notifications for fds from another process. this is partially handled
           * above with the gencounter check (== our fd is not the event fd), and
           * partially here, when epoll_ctl returns an error (== a child has the fd
           * but we closed it).
           */
          ev->events = (want & EV_READ  ? EPOLLIN  : 0)
                     | (want & EV_WRITE ? EPOLLOUT : 0);

          /* pre-2.6.9 kernels require a non-null pointer with EPOLL_CTL_DEL, */
          /* which is fortunately easy to do for us. */
          if (epoll_ctl (backend_fd, want ? EPOLL_CTL_MOD : EPOLL_CTL_DEL, fd, ev))
            {
              postfork |= 2; /* an error occurred, recreate kernel state */
              continue;
            }
        }

      fd_event (EV_A_ fd, got);
    }

  /* if the receive array was full, increase its size */
  if (expect_false (eventcnt == epoll_eventmax))
    {
      ev_free (epoll_events);
      epoll_eventmax = array_nextsize (sizeof (struct epoll_event), epoll_eventmax, epoll_eventmax + 1);
      epoll_events = (struct epoll_event *)ev_malloc (sizeof (struct epoll_event) * epoll_eventmax);
    }

  /* now synthesize events for all fds where epoll fails, while select works... */
  for (i = epoll_epermcnt; i--; )
    {
      int fd = epoll_eperms [i];
      unsigned char events = anfds [fd].events & (EV_READ | EV_WRITE);

      if (anfds [fd].emask & EV_EMASK_EPERM && events)
        fd_event (EV_A_ fd, events);
      else
        {
          epoll_eperms [i] = epoll_eperms [--epoll_epermcnt];
          anfds [fd].emask = 0;
        }
    }
}